

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req_test.c
# Opt level: O3

void test_req_ctx_send_twice(void)

{
  bool bVar1;
  bool bVar2;
  nng_err nVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  nng_aio **app;
  nng_msg **msgp;
  nng_msg *local_68;
  nng_msg *msg [2];
  nng_ctx local_4c;
  nng_aio *pnStack_48;
  nng_ctx ctx;
  nng_aio *aio [2];
  nng_socket req;
  
  nVar3 = nng_req0_open((nng_socket *)((long)aio + 0xc));
  pcVar5 = nng_strerror(nVar3);
  iVar4 = acutest_check_((uint)(nVar3 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                         ,800,"%s: expected success, got %s (%d)","nng_req0_open(&req)",pcVar5,nVar3
                        );
  if (iVar4 != 0) {
    nVar3 = nng_socket_set_ms(aio[1]._4_4_,"send-timeout",1000);
    pcVar5 = nng_strerror(nVar3);
    iVar4 = acutest_check_((uint)(nVar3 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                           ,0x321,"%s: expected success, got %s (%d)",
                           "nng_socket_set_ms(req, NNG_OPT_SENDTIMEO, 1000)",pcVar5,nVar3);
    if (iVar4 != 0) {
      nVar3 = nng_ctx_open(&local_4c,aio[1]._4_4_);
      pcVar5 = nng_strerror(nVar3);
      iVar4 = acutest_check_((uint)(nVar3 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                             ,0x322,"%s: expected success, got %s (%d)","nng_ctx_open(&ctx, req)",
                             pcVar5,nVar3);
      if (iVar4 != 0) {
        app = &stack0xffffffffffffffb8;
        msgp = &local_68;
        bVar1 = true;
        do {
          bVar2 = bVar1;
          nVar3 = nng_aio_alloc(app,(_func_void_void_ptr *)0x0,(void *)0x0);
          pcVar5 = nng_strerror(nVar3);
          iVar4 = acutest_check_((uint)(nVar3 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                                 ,0x325,"%s: expected success, got %s (%d)",
                                 "nng_aio_alloc(&aio[i], NULL, NULL)",pcVar5,nVar3);
          if (iVar4 == 0) goto LAB_00112f7b;
          nVar3 = nng_msg_alloc(msgp,0);
          pcVar5 = nng_strerror(nVar3);
          iVar4 = acutest_check_((uint)(nVar3 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                                 ,0x326,"%s: expected success, got %s (%d)",
                                 "nng_msg_alloc(&msg[i], 0)",pcVar5,nVar3);
          if (iVar4 == 0) goto LAB_00112f7b;
          msgp = msg;
          app = aio;
          bVar1 = false;
        } while (bVar2);
        nng_aio_set_msg(pnStack_48,local_68);
        nng_ctx_send(local_4c,pnStack_48);
        nuts_sleep(0x32);
        nng_aio_set_msg(aio[0],msg[0]);
        nng_ctx_send(local_4c,aio[0]);
        nuts_sleep(0x32);
        nVar3 = nng_socket_close(aio[1]._4_4_);
        pcVar5 = nng_strerror(nVar3);
        iVar4 = acutest_check_((uint)(nVar3 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                               ,0x32f,"%s: expected success, got %s (%d)","nng_socket_close(req)",
                               pcVar5,nVar3);
        if (iVar4 != 0) {
          nng_aio_wait(pnStack_48);
          nng_aio_wait(aio[0]);
          nVar3 = nng_aio_result(pnStack_48);
          pcVar5 = nng_strerror(NNG_ECANCELED);
          acutest_check_((uint)(nVar3 == NNG_ECANCELED),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                         ,0x332,"%s fails with %s","nng_aio_result(aio[0])",pcVar5);
          pcVar5 = nng_strerror(NNG_ECANCELED);
          pcVar6 = nng_strerror(nVar3);
          acutest_message_("%s: expected %s (%d), got %s (%d)","nng_aio_result(aio[0])",pcVar5,0x14,
                           pcVar6,(ulong)nVar3);
          nVar3 = nng_aio_result(aio[0]);
          pcVar5 = nng_strerror(NNG_ECLOSED);
          acutest_check_((uint)(nVar3 == NNG_ECLOSED),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                         ,0x333,"%s fails with %s","nng_aio_result(aio[1])",pcVar5);
          pcVar5 = nng_strerror(NNG_ECLOSED);
          pcVar6 = nng_strerror(nVar3);
          acutest_message_("%s: expected %s (%d), got %s (%d)","nng_aio_result(aio[1])",pcVar5,7,
                           pcVar6,(ulong)nVar3);
          nng_aio_free(pnStack_48);
          nng_msg_free(local_68);
          nng_aio_free(aio[0]);
          nng_msg_free(msg[0]);
          return;
        }
      }
    }
  }
LAB_00112f7b:
  acutest_abort_();
}

Assistant:

static void
test_req_ctx_send_twice(void)
{
	nng_socket req;
	nng_ctx    ctx;
	nng_aio   *aio[2];
	nng_msg   *msg[2];

	NUTS_PASS(nng_req0_open(&req));
	NUTS_PASS(nng_socket_set_ms(req, NNG_OPT_SENDTIMEO, 1000));
	NUTS_PASS(nng_ctx_open(&ctx, req));

	for (int i = 0; i < 2; i++) {
		NUTS_PASS(nng_aio_alloc(&aio[i], NULL, NULL));
		NUTS_PASS(nng_msg_alloc(&msg[i], 0));
	}

	for (int i = 0; i < 2; i++) {
		nng_aio_set_msg(aio[i], msg[i]);
		nng_ctx_send(ctx, aio[i]);
		NUTS_SLEEP(50);
	}

	NUTS_CLOSE(req);
	nng_aio_wait(aio[0]);
	nng_aio_wait(aio[1]);
	NUTS_FAIL(nng_aio_result(aio[0]), NNG_ECANCELED);
	NUTS_FAIL(nng_aio_result(aio[1]), NNG_ECLOSED);

	for (int i = 0; i < 2; i++) {
		nng_aio_free(aio[i]);
		nng_msg_free(msg[i]);
	}
}